

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void find_suite::adjacent_find(void)

{
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator iVar1;
  iterator iVar2;
  basic_iterator<int> first_end;
  allocator_type local_99;
  vector<int,_std::allocator<int>_> expect;
  int local_54 [3];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2100000021;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x2c;
  input._M_len = 5;
  input._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  first_end = std::
              __adjacent_find<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (iVar1.parent,iVar1.current,iVar2.parent,iVar2.current);
  local_54[0] = 0x16;
  __l._M_len = 1;
  __l._M_array = local_54;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_99);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x14b,"void find_suite::adjacent_find()",iVar1,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  local_54[0] = 0x21;
  local_54[1] = 0x21;
  local_54[2] = 0x2c;
  __l_00._M_len = 3;
  __l_00._M_array = local_54;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_99);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x150,"void find_suite::adjacent_find()",first_end,iVar1,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void adjacent_find()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 33, 44 };
    auto where = std::adjacent_find(span.begin(), span.end());
    {
        std::vector<int> expect = { 22 };
        BOOST_TEST_ALL_EQ(span.begin(), where,
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}